

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instancenorm.cpp
# Opt level: O2

int __thiscall ncnn::InstanceNorm::load_model(InstanceNorm *this,ModelBin *mb)

{
  int *piVar1;
  Allocator *pAVar2;
  int iVar3;
  void *local_78;
  int *local_70;
  size_t local_68;
  int local_60;
  Allocator *local_58;
  int local_50;
  int iStack_4c;
  int iStack_48;
  int iStack_44;
  int local_40;
  size_t local_38;
  
  iVar3 = 0;
  if (this->affine != 0) {
    (*mb->_vptr_ModelBin[2])(&local_78,mb,(ulong)(uint)this->channels,1);
    if (&this->gamma_data != (Mat *)&local_78) {
      if (local_70 != (int *)0x0) {
        LOCK();
        *local_70 = *local_70 + 1;
        UNLOCK();
      }
      piVar1 = (this->gamma_data).refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          pAVar2 = (this->gamma_data).allocator;
          if (pAVar2 == (Allocator *)0x0) {
            free((this->gamma_data).data);
          }
          else {
            (*pAVar2->_vptr_Allocator[3])();
          }
        }
      }
      (this->gamma_data).data = local_78;
      (this->gamma_data).refcount = local_70;
      (this->gamma_data).elemsize = local_68;
      (this->gamma_data).elempack = local_60;
      (this->gamma_data).allocator = local_58;
      (this->gamma_data).dims = local_50;
      (this->gamma_data).w = iStack_4c;
      (this->gamma_data).h = iStack_48;
      (this->gamma_data).d = iStack_44;
      (this->gamma_data).c = local_40;
      (this->gamma_data).cstep = local_38;
    }
    if (local_70 != (int *)0x0) {
      LOCK();
      *local_70 = *local_70 + -1;
      UNLOCK();
      if (*local_70 == 0) {
        if (local_58 == (Allocator *)0x0) {
          free(local_78);
        }
        else {
          (*local_58->_vptr_Allocator[3])();
        }
      }
    }
    if (((this->gamma_data).data != (void *)0x0) &&
       ((long)(this->gamma_data).c * (this->gamma_data).cstep != 0)) {
      (*mb->_vptr_ModelBin[2])(&local_78,mb,(ulong)(uint)this->channels,1);
      if (&this->beta_data != (Mat *)&local_78) {
        if (local_70 != (int *)0x0) {
          LOCK();
          *local_70 = *local_70 + 1;
          UNLOCK();
        }
        piVar1 = (this->beta_data).refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            pAVar2 = (this->beta_data).allocator;
            if (pAVar2 == (Allocator *)0x0) {
              free((this->beta_data).data);
            }
            else {
              (*pAVar2->_vptr_Allocator[3])();
            }
          }
        }
        (this->beta_data).data = local_78;
        (this->beta_data).refcount = local_70;
        (this->beta_data).elemsize = local_68;
        (this->beta_data).elempack = local_60;
        (this->beta_data).allocator = local_58;
        (this->beta_data).dims = local_50;
        (this->beta_data).w = iStack_4c;
        (this->beta_data).h = iStack_48;
        (this->beta_data).d = iStack_44;
        (this->beta_data).c = local_40;
        (this->beta_data).cstep = local_38;
      }
      if (local_70 != (int *)0x0) {
        LOCK();
        *local_70 = *local_70 + -1;
        UNLOCK();
        if (*local_70 == 0) {
          if (local_58 == (Allocator *)0x0) {
            free(local_78);
          }
          else {
            (*local_58->_vptr_Allocator[3])();
          }
        }
      }
      if (((this->beta_data).data != (void *)0x0) &&
         ((long)(this->beta_data).c * (this->beta_data).cstep != 0)) {
        return 0;
      }
    }
    iVar3 = -100;
  }
  return iVar3;
}

Assistant:

int InstanceNorm::load_model(const ModelBin& mb)
{
    if (affine == 0)
        return 0;

    gamma_data = mb.load(channels, 1);
    if (gamma_data.empty())
        return -100;

    beta_data = mb.load(channels, 1);
    if (beta_data.empty())
        return -100;

    return 0;
}